

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeViewPrivate::removeViewItems(QTreeViewPrivate *this,int pos,int count)

{
  pointer pQVar1;
  long lVar2;
  qsizetype qVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  QTreeViewItem *items;
  QList<QTreeViewItem> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  QList<QTreeViewItem>::remove((QList<QTreeViewItem> *)(in_RDI + 0x5a0),(char *)(long)in_ESI);
  pQVar1 = QList<QTreeViewItem>::data(in_stack_ffffffffffffffd0);
  local_1c = in_ESI;
  while( true ) {
    lVar2 = (long)local_1c;
    qVar3 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0));
    if (qVar3 <= lVar2) break;
    if (in_ESI <= pQVar1[local_1c].parentItem) {
      pQVar1[local_1c].parentItem = pQVar1[local_1c].parentItem - in_EDX;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void QTreeViewPrivate::removeViewItems(int pos, int count)
{
    viewItems.remove(pos, count);
    QTreeViewItem *items = viewItems.data();
    for (int i = pos; i < viewItems.size(); i++)
        if (items[i].parentItem >= pos)
            items[i].parentItem -= count;
}